

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_of(StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  stringpiece_ssize_type i;
  long lVar5;
  stringpiece_ssize_type length;
  char *data;
  bool lookup [256];
  char acStack_138 [264];
  
  lVar4 = s.length_;
  lVar1 = this->length_;
  if (0 < lVar4 && 0 < lVar1) {
    if (lVar4 == 1) {
      sVar3 = lVar1 - 1U;
      if (pos <= lVar1 - 1U) {
        sVar3 = pos;
      }
      do {
        if (this->ptr_[sVar3] == *s.ptr_) {
          return sVar3;
        }
        bVar2 = 0 < (long)sVar3;
        sVar3 = sVar3 - 1;
      } while (bVar2);
    }
    else {
      lVar5 = 0;
      memset(acStack_138,0,0x100);
      do {
        acStack_138[(byte)s.ptr_[lVar5]] = '\x01';
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      sVar3 = lVar1 - 1U;
      if (pos <= lVar1 - 1U) {
        sVar3 = pos;
      }
      do {
        if (acStack_138[(byte)this->ptr_[sVar3]] != '\0') {
          return sVar3;
        }
        bVar2 = 0 < (long)sVar3;
        sVar3 = sVar3 - 1;
      } while (bVar2);
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i =
       std::min(pos, static_cast<size_type>(length_ - 1)); i >= 0; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}